

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Abc_Cex_t *p;
  char *pcVar7;
  uint local_44;
  int Entry;
  int i;
  int Counter;
  int nCexes;
  Abc_Cex_t *pTemp;
  int fShort;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = true;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"sh");
    if (iVar2 == -1) {
      Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,(ulong)(uint)pAbc->nFrames
               );
      if ((pAbc->pCex == (Abc_Cex_t *)0x0) && (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
        Abc_Print(1,"Cex is not defined.\n");
      }
      else {
        if (pAbc->pCex != (Abc_Cex_t *)0x0) {
          Abc_CexPrintStats(pAbc->pCex);
        }
        if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
          Entry = 0;
          printf("\n");
          for (pTemp._4_4_ = 0; iVar2 = Vec_PtrSize(pAbc->vCexVec), pTemp._4_4_ < iVar2;
              pTemp._4_4_ = pTemp._4_4_ + 1) {
            p = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,pTemp._4_4_);
            if (p == (Abc_Cex_t *)0x1) {
              Entry = Entry + 1;
            }
            else if (p != (Abc_Cex_t *)0x0) {
              printf("%4d : ");
              Abc_CexPrintStats(p);
            }
          }
          if (Entry != 0) {
            uVar3 = Vec_PtrSize(pAbc->vCexVec);
            printf("In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n",
                   (ulong)(uint)Entry,(ulong)uVar3);
          }
        }
      }
      if (pAbc->vStatuses != (Vec_Int_t *)0x0) {
        if (bVar1) {
          uVar3 = Vec_IntCountEntry(pAbc->vStatuses,0);
          uVar4 = Vec_IntCountEntry(pAbc->vStatuses,1);
          uVar5 = Vec_IntCountEntry(pAbc->vStatuses,-1);
          uVar6 = Vec_IntSize(pAbc->vStatuses);
          printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                 (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
        }
        else {
          for (local_44 = 0; iVar2 = Vec_IntSize(pAbc->vStatuses), (int)local_44 < iVar2;
              local_44 = local_44 + 1) {
            uVar3 = Vec_IntEntry(pAbc->vStatuses,local_44);
            printf("%d=%d  ",(ulong)local_44,(ulong)uVar3);
          }
        }
        printf("\n");
      }
      return 0;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x73)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: print_status [-sh]\n");
  Abc_Print(-2,"\t        prints verification status\n");
  pcVar7 = "no";
  if (bVar1) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-s    : toggle using short print-out [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fShort = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
            if ( Counter )
                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).", 
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1), 
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-sh]\n" );
    Abc_Print( -2, "\t        prints verification status\n" );
    Abc_Print( -2, "\t-s    : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}